

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnExpr(BinaryReaderInterp *this)

{
  bool bVar1;
  Result RVar2;
  u32 local_20;
  u32 local_1c;
  Index keep_count;
  Index drop_count;
  BinaryReaderInterp *this_local;
  
  _keep_count = this;
  RVar2 = GetReturnDropKeepCount(this,&local_1c,&local_20);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = SharedValidator::OnReturn
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc)
    ;
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Istream::EmitDropKeep(this->istream_,local_1c,local_20);
      Istream::Emit(this->istream_,Return);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnReturnExpr() {
  Index drop_count, keep_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(validator_.OnReturn(loc));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::Return);
  return Result::Ok;
}